

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter-flate.c
# Opt level: O3

hd_stream * hd_open_flated(hd_context *ctx,hd_stream *chain,int window_bits)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  hd_stream *phVar3;
  hd_flate *state;
  int code;
  undefined8 *local_30;
  int local_24;
  
  local_30 = (undefined8 *)0x0;
  local_24 = 0;
  hd_var_imp(&local_24);
  hd_var_imp(&local_30);
  iVar2 = hd_push_try(ctx);
  if (iVar2 != 0) {
    iVar2 = __sigsetjmp(ctx->error->top->buffer,0);
    if (iVar2 == 0) {
      local_30 = (undefined8 *)hd_calloc(ctx,1,0x1078);
      *local_30 = chain;
      local_30[9] = zalloc_flate;
      local_30[10] = zfree_flate;
      local_30[0xb] = ctx;
      local_30[1] = 0;
      *(undefined4 *)(local_30 + 2) = 0;
      local_24 = inflateInit2_(local_30 + 1,window_bits,"1.2.11",0x70);
      if (local_24 != 0) {
        hd_throw(ctx,2,"zlib error: inflateInit: %s",local_30[7]);
      }
    }
  }
  phVar1 = ctx->error->top;
  ctx->error->top = phVar1 + -1;
  if (phVar1->code < 2) {
    phVar3 = hd_new_stream(ctx,local_30,next_flated,close_flated);
    return phVar3;
  }
  if ((local_30 != (undefined8 *)0x0) && (local_24 == 0)) {
    inflateEnd(local_30 + 1);
  }
  hd_free(ctx,local_30);
  hd_drop_stream(ctx,chain);
  hd_rethrow(ctx);
}

Assistant:

hd_stream *
hd_open_flated(hd_context *ctx, hd_stream *chain, int window_bits)
{
    hd_flate *state = NULL;
    int code = Z_OK;

    hd_var(code);
    hd_var(state);

    hd_try(ctx)
    {
        state = hd_malloc_struct(ctx, hd_flate);
        state->chain = chain;

        state->z.zalloc = zalloc_flate;
        state->z.zfree = zfree_flate;
        state->z.opaque = ctx;
        state->z.next_in = NULL;
        state->z.avail_in = 0;

        code = inflateInit2(&state->z, window_bits);
        if (code != Z_OK)
            hd_throw(ctx, HD_ERROR_GENERIC, "zlib error: inflateInit: %s", state->z.msg);
    }
    hd_catch(ctx)
    {
        if (state && code == Z_OK)
            inflateEnd(&state->z);
        hd_free(ctx, state);
        hd_drop_stream(ctx, chain);
        hd_rethrow(ctx);
    }
    return hd_new_stream(ctx, state, next_flated, close_flated);
}